

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O0

void __thiscall cmDebugServerConsole::OnChangeState(cmDebugServerConsole *this)

{
  bool bVar1;
  int iVar2;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  cmListFileContext currentLine;
  cmPauseContext ctx;
  allocator local_31;
  string local_30;
  cmDebugServerConsole *local_10;
  cmDebugServerConsole *this_local;
  
  local_10 = this;
  cmDebuggerListener::OnChangeState(&(this->super_cmDebugServer).super_cmDebuggerListener);
  iVar2 = (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[9])();
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"Unknown state\n",&local_1d1);
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    printPrompt(this,(cmConnection *)0x0);
  }
  else if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"Running...\n",&local_31);
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (iVar2 == 2) {
    (*((this->super_cmDebugServer).super_cmDebuggerListener.Debugger)->_vptr_cmDebugger[0x17])();
    bVar1 = cmPauseContext::operator_cast_to_bool((cmPauseContext *)&currentLine.Line);
    if (bVar1) {
      cmPauseContext::CurrentLine((cmListFileContext *)local_a8,(cmPauseContext *)&currentLine.Line)
      ;
      std::operator+(&local_168,"Paused at ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&currentLine.Name.field_2 + 8));
      std::operator+(&local_148,&local_168,":");
      std::__cxx11::to_string(&local_188,currentLine.FilePath.field_2._8_8_);
      std::operator+(&local_128,&local_148,&local_188);
      std::operator+(&local_108,&local_128," (");
      std::operator+(&local_e8,&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::operator+(&local_c8,&local_e8,")\n");
      cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_a8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1a8,"Paused at indeterminate state\n",&local_1a9);
      cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    }
    cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&PROMPT_abi_cxx11_);
    cmPauseContext::~cmPauseContext((cmPauseContext *)&currentLine.Line);
  }
  return;
}

Assistant:

void cmDebugServerConsole::OnChangeState()
{
  cmDebugServer::OnChangeState();

  switch (Debugger.CurrentState()) {
    case cmDebugger::State::Running:
      AsyncBroadcast("Running...\n");
      break;
    case cmDebugger::State::Paused: {
      auto ctx = Debugger.PauseContext();
      if (ctx) {
        auto currentLine = ctx.CurrentLine();
        AsyncBroadcast("Paused at " + currentLine.FilePath + ":" +
                       std::to_string(currentLine.Line) + " (" +
                       currentLine.Name + ")\n");
      } else {
        AsyncBroadcast("Paused at indeterminate state\n");
      }
      AsyncBroadcast(PROMPT);
    } break;
    case cmDebugger::State::Unknown:
      AsyncBroadcast("Unknown state\n");
      printPrompt();
      break;
  }
}